

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_long,char_const(&)[16],unsigned_int_const&,unsigned_int_const&,std::__cxx11::string>
          (ValidationContext *this,IssueError *issue,uint *args,unsigned_long *args_1,
          char (*args_2) [16],uint *args_3,uint *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  uint *args_4_00;
  char (*args_2_00) [16];
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined1 *in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  ValidationReport *in_stack_00000010;
  undefined1 in_stack_00000058 [16];
  string_view in_stack_00000068;
  ValidationReport *in_stack_fffffffffffffdf0;
  undefined1 *puVar2;
  uint *args_3_00;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  allocator<char> local_1b1;
  undefined1 local_1b0;
  undefined2 local_1ae;
  uint local_1a8 [8];
  undefined1 auStack_188 [32];
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 *local_148;
  undefined1 local_138 [96];
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  local_168 = in_R9;
  local_160 = in_R8;
  local_158 = in_RCX;
  local_150 = in_RDX;
  local_148 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
  args_4_00 = (uint *)(in_RDI + 8);
  local_1b0 = *local_148;
  local_1ae = *(undefined2 *)(local_148 + 2);
  args_3_00 = local_1a8;
  args_2_00 = (char (*) [16])(local_148 + 8);
  __a = &local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,__a);
  puVar2 = auStack_188;
  local_60 = (undefined8 *)(local_148 + 0x18);
  local_58 = &stack0xfffffffffffffe28;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(local_148 + 0x20);
  s._M_str = in_RDI;
  s._M_len = (size_t)puVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)in_stack_fffffffffffffdf0,s);
  local_8 = local_60;
  local_90 = local_150;
  local_98 = local_158;
  local_a0 = local_160;
  local_a8 = local_168;
  local_50 = local_88;
  local_78 = puVar2;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long,char_const[16],unsigned_int_const,unsigned_int_const,std::__cxx11::string>
            ((uint *)in_stack_fffffffffffffe28,(unsigned_long *)__a,args_2_00,args_3_00,args_4_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)issue);
  local_30 = &local_d8;
  local_38 = local_138;
  local_20 = 0xd22c42;
  local_d8 = 0xd22c42;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_d0 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_00000068,(format_args)in_stack_00000058);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_fffffffffffffdf0,
             in_stack_00000010);
  ValidationReport::~ValidationReport(in_stack_fffffffffffffdf0);
  std::allocator<char>::~allocator(&local_1b1);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }